

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cash.cpp
# Opt level: O0

void __thiscall Cash::save(Cash *this,ofstream *file)

{
  ostream *poVar1;
  Transaction local_70;
  Transaction local_40;
  int local_1c;
  ofstream *local_18;
  ofstream *file_local;
  Cash *this_local;
  
  local_18 = file;
  file_local = (ofstream *)this;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)file,std::fixed);
  local_1c = (int)std::setprecision(2);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_1c);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Transaction).id);
  poVar1 = std::operator<<(poVar1,",");
  Transaction::getSenderName_abi_cxx11_(&local_40);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,",");
  Transaction::getReceiverName_abi_cxx11_(&local_70);
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Transaction).amount);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Cash::save(ofstream &file) const
{
    file << fixed << setprecision(2) << id << "," << Transaction::getSenderName() << "," << Transaction::getReceiverName() << "," << amount << endl;
}